

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8556a::data<float>::checkValues
          (data<float> *this,vector<float,_std::allocator<float>_> *data,Box2i *dw,
          bool dontbothercheckingdepth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pbVar4;
  pointer pvVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  undefined7 in_register_00000009;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar6 = (dw->min).y;
  iVar1 = (dw->max).x;
  iVar2 = (dw->min).x;
  iVar3 = (dw->max).y;
  lVar7 = (long)(((iVar3 - iVar6) + 1) * ((iVar1 - iVar2) + 1));
  if (iVar3 < iVar6) {
    lVar7 = 1;
  }
  if (iVar1 < iVar2) {
    lVar7 = 1;
  }
  lVar7 = ((long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) + lVar7;
  if ((int)CONCAT71(in_register_00000009,dontbothercheckingdepth) == 0) {
    if (lVar7 != 0) {
      lVar11 = 0;
      lVar10 = 0;
      lVar9 = 0;
      do {
        if (0.005 < ABS(*(float *)(*(long *)&(this->_results).
                                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data + lVar10 * 4) -
                        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar11])) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sample ",7);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," (channel ",10);
          pbVar4 = (this->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar4[lVar10]._M_dataplus._M_p,pbVar4[lVar10]._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," of pixel ",10);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"doesn\'t match expected value (channel ",0x26);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," of pixel ",10);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") : ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got ",4);
          poVar8 = std::ostream::_M_insert<double>
                             ((double)(data->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start[lVar11]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," expected ",10);
          poVar8 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(this->_results).
                                                                                                                      
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar10 * 4));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        pvVar5 = (this->_results).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (0.005 < ABS(*(float *)(*(long *)&pvVar5[lVar9].
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data + lVar10 * 4) -
                        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar11])) {
          __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                        ,0x182,
                        "void (anonymous namespace)::data<float>::checkValues(const vector<T> &, const Box2i &, bool) [T = float]"
                       );
        }
        lVar10 = lVar10 + 1;
        if (lVar10 == (long)(this->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) {
          lVar9 = lVar9 + 1;
          if (lVar9 == ((long)(this->_results).
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                       -0x5555555555555555) {
            lVar9 = 0;
          }
          lVar10 = 0;
        }
        lVar11 = lVar11 + 1;
      } while (lVar7 != lVar11);
    }
  }
  else if (lVar7 != 0) {
    lVar9 = 0;
    lVar11 = 0;
    lVar10 = 0;
    do {
      iVar6 = std::__cxx11::string::compare
                        ((char *)((this->_channels).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar11));
      if ((iVar6 != 0) &&
         (iVar6 = std::__cxx11::string::compare
                            ((char *)((this->_channels).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar11)),
         iVar6 != 0)) {
        if (0.005 < ABS(*(float *)(*(long *)&(this->_results).
                                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data + lVar11 * 4) -
                        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar9])) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sample ",7);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," (channel ",10);
          pbVar4 = (this->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar4[lVar11]._M_dataplus._M_p,pbVar4[lVar11]._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," of pixel ",10);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"doesn\'t match expected value (channel ",0x26);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," of pixel ",10);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") : ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got ",4);
          poVar8 = std::ostream::_M_insert<double>
                             ((double)(data->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start[lVar9]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," expected ",10);
          poVar8 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(this->_results).
                                                                                                                      
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar11 * 4));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        if (0.005 < ABS(*(float *)(*(long *)&(this->_results).
                                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data + lVar11 * 4) -
                        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar9])) {
          __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                        ,0x16a,
                        "void (anonymous namespace)::data<float>::checkValues(const vector<T> &, const Box2i &, bool) [T = float]"
                       );
        }
      }
      lVar11 = lVar11 + 1;
      if (lVar11 == (long)(this->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) {
        lVar10 = lVar10 + 1;
        if (lVar10 == ((long)(this->_results).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_results).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
        {
          lVar10 = 0;
        }
        lVar11 = 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  return;
}

Assistant:

void checkValues (
        const vector<T>& data, const Box2i& dw, bool dontbothercheckingdepth)
    {
        size_t size =
            _channels.size () + (dw.size ().x + 1) * (dw.size ().y + 1);
        size_t pel     = 0;
        size_t channel = 0;
        if (dontbothercheckingdepth)
        {
            for (size_t i = 0; i < size; i++)
            {
                if (_channels[channel] != "Z" && _channels[channel] != "ZBack")
                {
                    if (fabs (_results[pel][channel] - data[i]) > 0.005)
                    {
                        cout << "sample " << i << " (channel "
                             << _channels[channel] << " of pixel "
                             << i % _channels.size () << ") ";
                        cout << "doesn't match expected value (channel "
                             << channel << " of pixel " << pel << ") : ";
                        cout << "got " << data[i] << " expected "
                             << _results[pel][channel] << endl;
                    }
                    assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                }
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
        else
        {
            for (size_t i = 0; i < size; i++)
            {
                if (fabs (_results[pel][channel] - data[i]) > 0.005)
                {
                    cout << "sample " << i << " (channel " << _channels[channel]
                         << " of pixel " << i % _channels.size () << ") ";
                    cout << "doesn't match expected value (channel " << channel
                         << " of pixel " << pel << ") : ";
                    cout << "got " << data[i] << " expected "
                         << _results[pel][channel] << endl;
                }
                assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
    }